

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::advance_past_empty_and_deleted
          (dense_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *this)

{
  bool bVar1;
  iterator *in_RDI;
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *unaff_retaddr;
  bool local_12;
  bool local_11;
  iterator *it;
  
  it = in_RDI;
  while( true ) {
    local_11 = false;
    if (in_RDI->pos != in_RDI->end) {
      bVar1 = dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
              ::test_empty(unaff_retaddr,it);
      local_12 = true;
      if (!bVar1) {
        local_12 = dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                   ::test_deleted(unaff_retaddr,it);
      }
      local_11 = local_12;
    }
    if (local_11 == false) break;
    in_RDI->pos = in_RDI->pos + 1;
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }